

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.cpp
# Opt level: O0

void find(void)

{
  mapped_type *pmVar1;
  iterator ppVar2;
  key_type local_5b [26];
  key_type local_41;
  iterator local_40;
  iterator it;
  undefined1 local_30 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> mymap;
  
  eastl::allocator::allocator((allocator *)((long)&it + 6),"EASTL vector");
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
             (key_compare *)((long)&it + 7),(allocator *)((long)&it + 6));
  local_41 = 'a';
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &local_41);
  *pmVar1 = 0x32;
  local_5b[6] = 0x62;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b + 6);
  *pmVar1 = 100;
  local_5b[5] = 99;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b + 5);
  *pmVar1 = 0x96;
  local_5b[4] = 100;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b + 4);
  *pmVar1 = 200;
  local_5b[3] = 0x62;
  local_40 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::find
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                        local_5b + 3);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::erase
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,local_40);
  local_5b[2] = 100;
  ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::find
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b + 2);
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::erase
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,ppVar2);
  local_5b[1] = 0x61;
  ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::find
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b + 1);
  if (ppVar2->second != 0x32) {
    __assert_fail("mymap.find(\'a\')->second == 50",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                  ,0x176,"void find()");
  }
  local_5b[0] = 'c';
  ppVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::find
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_5b);
  if (ppVar2->second == 0x96) {
    eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
              ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    return;
  }
  __assert_fail("mymap.find(\'c\')->second == 150",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                ,0x177,"void find()");
}

Assistant:

static void find() {
  eastl::vector_map<char, int> mymap;
  eastl::vector_map<char, int>::iterator it;

  mymap['a']=50;
  mymap['b']=100;
  mymap['c']=150;
  mymap['d']=200;

  it=mymap.find('b');
  mymap.erase (it);
  mymap.erase (mymap.find('d'));

  // print content:
  assert(mymap.find('a')->second ==  50);
  assert(mymap.find('c')->second == 150);
}